

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* kratos::line_wrap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *text,uint32_t line_width)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  string *psVar4;
  ulong local_200;
  size_t space_left;
  undefined1 local_1e8 [8];
  string line;
  string word;
  istringstream local_1a0 [8];
  istringstream words;
  uint32_t line_width_local;
  string *text_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)text,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1e8);
  piVar2 = std::operator>>((istream *)local_1a0,(string *)(line.field_2._M_local_buf + 8));
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    std::__cxx11::string::append((string *)local_1e8);
    lVar3 = std::__cxx11::string::length();
    local_200 = (ulong)line_width - lVar3;
    while( true ) {
      piVar2 = std::operator>>((istream *)local_1a0,(string *)(line.field_2._M_local_buf + 8));
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      lVar3 = std::__cxx11::string::length();
      if (local_200 < lVar3 + 1U) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
        std::__cxx11::string::operator=
                  ((string *)local_1e8,(string *)(line.field_2._M_local_buf + 8));
        lVar3 = std::__cxx11::string::length();
        local_200 = (ulong)line_width - lVar3;
      }
      else {
        psVar4 = (string *)std::__cxx11::string::append(local_1e8);
        std::__cxx11::string::append(psVar4);
        lVar3 = std::__cxx11::string::length();
        local_200 = local_200 - (lVar3 + 1);
      }
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> line_wrap(const std::string &text, uint32_t line_width) {
    // adapted from https://www.rosettacode.org/wiki/Word_wrap#C.2B.2B
    std::istringstream words(text);
    std::vector<std::string> result;
    std::string word;
    std::string line;

    if (words >> word) {
        line.append(word);
        size_t space_left = line_width - word.length();
        while (words >> word) {
            if (space_left < word.length() + 1) {
                result.emplace_back(line);
                line = word;
                space_left = line_width - word.length();
            } else {
                line.append(" ").append(word);
                space_left -= word.length() + 1;
            }
        }
    }
    result.emplace_back(line);
    return result;
}